

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O2

void __thiscall bloaty::Options::Clear(Options *this)

{
  uint uVar1;
  string *psVar2;
  
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->filename_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->base_filename_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->data_source_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<bloaty::CustomDataSource>::TypeHandler>
            (&(this->custom_data_source_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->debug_filename_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->source_map_).super_RepeatedPtrFieldBase);
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar2 = (this->disassemble_function_).ptr_;
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
    if ((uVar1 & 2) != 0) {
      psVar2 = (this->source_filter_).ptr_;
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
  }
  if ((uVar1 & 0xfc) != 0) {
    this->debug_vmaddr_ = 0;
    this->debug_fileoff_ = 0;
    this->demangle_ = 0;
    this->sort_by_ = 0;
    this->verbose_level_ = 0;
    this->dump_raw_map_ = false;
    *(undefined3 *)&this->field_0xc5 = 0;
  }
  this->max_rows_per_level_ = 0x14;
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

void Options::Clear() {
// @@protoc_insertion_point(message_clear_start:bloaty.Options)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  filename_.Clear();
  base_filename_.Clear();
  data_source_.Clear();
  custom_data_source_.Clear();
  debug_filename_.Clear();
  source_map_.Clear();
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      disassemble_function_.ClearNonDefaultToEmptyNoArena();
    }
    if (cached_has_bits & 0x00000002u) {
      source_filter_.ClearNonDefaultToEmptyNoArena();
    }
  }
  if (cached_has_bits & 0x000000fcu) {
    ::memset(&demangle_, 0, static_cast<size_t>(
        reinterpret_cast<char*>(&debug_fileoff_) -
        reinterpret_cast<char*>(&demangle_)) + sizeof(debug_fileoff_));
  }
  max_rows_per_level_ = PROTOBUF_LONGLONG(20);
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}